

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_referenceType_withStorage
          (sysbvm_context_t *context,sysbvm_tuple_t referenceType,sysbvm_tuple_t storage)

{
  ulong uVar1;
  uint uVar2;
  sysbvm_object_tuple_t *psVar3;
  
  if (((referenceType & 0xf) == 0 && referenceType != 0) &&
     ((*(byte *)(referenceType + 8) & 0x80) == 0)) {
    uVar1 = *(ulong *)(referenceType + 0x70);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      uVar2 = (uint)((long)uVar1 >> 4);
    }
    else {
      uVar2 = (uint)*(undefined8 *)(uVar1 + 0x10);
    }
  }
  else {
    uVar2 = 0;
  }
  if ((uVar2 >> 10 & 1) == 0) {
    sysbvm_error("Expected a reference type");
  }
  psVar3 = sysbvm_context_allocatePointerTuple(context,referenceType,1);
  (psVar3->field_1).pointers[0] = storage;
  return (sysbvm_tuple_t)psVar3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_referenceType_withStorage(sysbvm_context_t *context, sysbvm_tuple_t referenceType, sysbvm_tuple_t storage)
{
    if(!sysbvm_type_isReferenceType(referenceType))
        sysbvm_error("Expected a reference type");

    sysbvm_object_tuple_t *reference = sysbvm_context_allocatePointerTuple(context, referenceType, 1);
    reference->pointers[0] = storage;
    return (sysbvm_tuple_t)reference;
}